

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O0

void zt_log_get_debug_info(char **file,int *line,char **func)

{
  zt_log_ctx_ty *pzVar1;
  undefined8 *in_RDX;
  int *in_RSI;
  undefined8 *in_RDI;
  zt_log_ctx_ty *ctx;
  
  pzVar1 = zt_log_get_ctx();
  if (pzVar1 == (zt_log_ctx_ty *)0x0) {
    *in_RDI = 0;
    *in_RSI = 0;
    *in_RDX = 0;
  }
  else {
    *in_RDI = pzVar1->file;
    *in_RSI = pzVar1->line;
    *in_RDX = pzVar1->function;
  }
  return;
}

Assistant:

void
zt_log_get_debug_info(const char ** file, int * line, const char ** func) {
    zt_log_ctx_ty   * ctx = NULL;

    if ((ctx = zt_log_get_ctx()) == NULL) {
        *file = NULL;
        *line = 0;
        *func = NULL;
        return;
    }

    *file = ctx->file;
    *line = ctx->line;
    *func = ctx->function;
}